

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O0

int Raig_ManSimulateRound(Raig_Man_t *p,int fMiter,int fFirst,int *piPat)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint Const;
  int iPioNum;
  int iFan1;
  int iFan0;
  int nCos;
  int nCis;
  int w;
  int i;
  uint *pRes;
  uint *pRes1;
  uint *pRes0;
  int *piPat_local;
  int fFirst_local;
  int fMiter_local;
  Raig_Man_t *p_local;
  
  for (nCis = 0; iVar1 = Vec_IntSize(p->vCis2Ids), nCis < iVar1; nCis = nCis + 1) {
    iVar1 = Vec_IntEntry(p->vCis2Ids,nCis);
    if (p->nPis <= iVar1) {
      iVar4 = Vec_IntEntry(p->vLos,iVar1 - p->nPis);
      puVar5 = Raig_ManSimRef(p,iVar4);
      if (fFirst == 0) {
        iVar4 = Vec_IntEntry(p->vLis,iVar1 - p->nPis);
        puVar6 = Raig_ManSimDeref(p,iVar4);
        for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
          puVar5[nCos] = puVar6[nCos];
        }
      }
      else {
        memset(puVar5 + 1,0,(long)p->nWords << 2);
      }
      if (*puVar5 == 0) {
        *puVar5 = 1;
        iVar1 = Vec_IntEntry(p->vLos,iVar1 - p->nPis);
        Raig_ManSimDeref(p,iVar1);
      }
    }
  }
  iFan1 = 0;
  iFan0 = 0;
  for (nCis = 2; nCis < p->nObjs; nCis = nCis + 1) {
    if (p->pFans0[nCis] == 0) {
      iVar1 = Vec_IntEntry(p->vCis2Ids,iFan0);
      if (iVar1 < p->nPis) {
        puVar5 = Raig_ManSimRef(p,nCis);
        for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
          uVar2 = Aig_ManRandom(0);
          puVar5[nCos] = uVar2;
        }
        if (*puVar5 == 0) {
          *puVar5 = 1;
          Raig_ManSimDeref(p,nCis);
        }
      }
      else {
        iVar1 = Vec_IntEntry(p->vLos,iVar1 - p->nPis);
        if (iVar1 != nCis) {
          __assert_fail("Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                        ,0x15d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
        }
      }
      iFan0 = iFan0 + 1;
    }
    else if (p->pFans1[nCis] == 0) {
      iVar1 = Raig_Lit2Var(p->pFans0[nCis]);
      puVar5 = Raig_ManSimDeref(p,iVar1);
      if ((iFan1 < p->nPos) && (fMiter != 0)) {
        iVar1 = Raig_LitIsCompl(p->pFans0[nCis]);
        uVar2 = 0;
        if (iVar1 != 0) {
          uVar2 = 0xffffffff;
        }
        for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
          if (puVar5[nCos] != uVar2) {
            iVar1 = Aig_WordFindFirstBit(puVar5[nCos] ^ uVar2);
            *piPat = (nCos + -1) * 0x20 + iVar1;
            return nCis;
          }
        }
      }
      else {
        puVar6 = Raig_ManSimRef(p,nCis);
        if (*puVar6 != 1) {
          __assert_fail("pRes[0] == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                        ,0x171,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
        }
        iVar1 = Raig_LitIsCompl(p->pFans0[nCis]);
        if (iVar1 == 0) {
          for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
            puVar6[nCos] = puVar5[nCos];
          }
        }
        else {
          for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
            puVar6[nCos] = puVar5[nCos] ^ 0xffffffff;
          }
        }
      }
      iFan1 = iFan1 + 1;
    }
    else {
      puVar5 = Raig_ManSimRef(p,nCis);
      if (*puVar5 == 0) {
        __assert_fail("pRes[0] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                      ,0x17d,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
      }
      iVar1 = p->pFans0[nCis];
      iVar4 = p->pFans1[nCis];
      iVar3 = Raig_Lit2Var(p->pFans0[nCis]);
      puVar6 = Raig_ManSimDeref(p,iVar3);
      iVar3 = Raig_Lit2Var(p->pFans1[nCis]);
      puVar7 = Raig_ManSimDeref(p,iVar3);
      iVar3 = Raig_LitIsCompl(iVar1);
      if ((iVar3 == 0) || (iVar3 = Raig_LitIsCompl(iVar4), iVar3 == 0)) {
        iVar3 = Raig_LitIsCompl(iVar1);
        if ((iVar3 == 0) || (iVar3 = Raig_LitIsCompl(iVar4), iVar3 != 0)) {
          iVar3 = Raig_LitIsCompl(iVar1);
          if ((iVar3 == 0) && (iVar3 = Raig_LitIsCompl(iVar4), iVar3 != 0)) {
            for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
              puVar5[nCos] = puVar6[nCos] & (puVar7[nCos] ^ 0xffffffff);
            }
          }
          else {
            iVar1 = Raig_LitIsCompl(iVar1);
            if ((iVar1 == 0) && (iVar1 = Raig_LitIsCompl(iVar4), iVar1 == 0)) {
              for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
                puVar5[nCos] = puVar6[nCos] & puVar7[nCos];
              }
            }
          }
        }
        else {
          for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
            puVar5[nCos] = (puVar6[nCos] ^ 0xffffffff) & puVar7[nCos];
          }
        }
      }
      else {
        for (nCos = 1; nCos <= p->nWords; nCos = nCos + 1) {
          puVar5[nCos] = (puVar6[nCos] | puVar7[nCos]) ^ 0xffffffff;
        }
      }
    }
  }
  if (iFan0 != p->nCis) {
    __assert_fail("nCis == p->nCis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,399,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  if (iFan1 == p->nCos) {
    iVar1 = p->nMems;
    iVar4 = Vec_IntSize(p->vLis);
    if (iVar1 == iVar4 + 1) {
      return 0;
    }
    __assert_fail("p->nMems == 1 + Vec_IntSize(p->vLis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                  ,0x191,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
  }
  __assert_fail("nCos == p->nCos",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSimSeq.c"
                ,400,"int Raig_ManSimulateRound(Raig_Man_t *, int, int, int *)");
}

Assistant:

int Raig_ManSimulateRound( Raig_Man_t * p, int fMiter, int fFirst, int * piPat )
{ 
    unsigned * pRes0, * pRes1, * pRes;
    int i, w, nCis, nCos, iFan0, iFan1, iPioNum;
    // nove the values to the register outputs
    Vec_IntForEachEntry( p->vCis2Ids, iPioNum, i )
    {
        if ( iPioNum < p->nPis )
            continue;
        pRes = Raig_ManSimRef( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        if ( fFirst )
            memset( pRes + 1, 0, sizeof(unsigned) * p->nWords );
        else
        {
            pRes0 = Raig_ManSimDeref( p, Vec_IntEntry(p->vLis, iPioNum-p->nPis) );
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w];
        }
        // handle unused PIs
        if ( pRes[0] == 0 ) 
        {
            pRes[0] = 1;
            Raig_ManSimDeref( p, Vec_IntEntry(p->vLos, iPioNum-p->nPis) );
        }
    }
    // simulate the logic
    nCis = nCos = 0;
    for ( i = 2; i < p->nObjs; i++ )
    {
        if ( p->pFans0[i] == 0 ) // ci always has zero first fanin
        {
            iPioNum = Vec_IntEntry( p->vCis2Ids, nCis );
            if ( iPioNum < p->nPis )
            {
                pRes = Raig_ManSimRef( p, i );
                for ( w = 1; w <= p->nWords; w++ )
                    pRes[w] = Aig_ManRandom( 0 );
                // handle unused PIs
                if ( pRes[0] == 0 ) 
                {
                    pRes[0] = 1;
                    Raig_ManSimDeref( p, i );
                }
            }
            else
                assert( Vec_IntEntry(p->vLos, iPioNum-p->nPis) == i );
            nCis++;
            continue;
        }
        if ( p->pFans1[i] == 0 ) // co always has non-zero 1st fanin and zero 2nd fanin
        {
            pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
            if ( nCos < p->nPos && fMiter )
            {
                unsigned Const = Raig_LitIsCompl(p->pFans0[i])? ~0 : 0;
                for ( w = 1; w <= p->nWords; w++ )
                    if ( pRes0[w] != Const )
                    {
                        *piPat = 32*(w-1) + Aig_WordFindFirstBit( pRes0[w] ^ Const );
                        return i;
                    }
            }
            else
            {
                pRes = Raig_ManSimRef( p, i );
                assert( pRes[0] == 1 );
                if ( Raig_LitIsCompl(p->pFans0[i]) )
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = ~pRes0[w];
                else
                    for ( w = 1; w <= p->nWords; w++ )
                        pRes[w] = pRes0[w];
            }
            nCos++;
            continue;
        }
        pRes  = Raig_ManSimRef( p, i );
        assert( pRes[0] > 0 );
        iFan0 = p->pFans0[i];
        iFan1 = p->pFans1[i];
        pRes0 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans0[i]) );
        pRes1 = Raig_ManSimDeref( p, Raig_Lit2Var(p->pFans1[i]) );
        if ( Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~(pRes0[w] | pRes1[w]);
        else if ( Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = ~pRes0[w] & pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & ~pRes1[w];
        else if ( !Raig_LitIsCompl(iFan0) && !Raig_LitIsCompl(iFan1) )
            for ( w = 1; w <= p->nWords; w++ )
                pRes[w] = pRes0[w] & pRes1[w];
    }
    assert( nCis == p->nCis );
    assert( nCos == p->nCos );
    assert( p->nMems == 1 + Vec_IntSize(p->vLis) );
    return 0;
}